

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeWorkItem.cpp
# Opt level: O1

void __thiscall
JITTimeWorkItem::InitializeReader
          (JITTimeWorkItem *this,ByteCodeReader *reader,
          StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
          *statementReader,ArenaAllocator *alloc)

{
  JITTimeFunctionBody *pJVar1;
  Type TVar2;
  int iVar3;
  List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  JITLoopHeaderIDL *pJVar8;
  ArenaStatementMapList *pAVar9;
  StatementMapIDL *pSVar10;
  byte *pbVar11;
  FunctionProxy *this_01;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  undefined4 *puVar12;
  Type *pTVar13;
  Type *ppSVar14;
  ulong uVar15;
  uint index;
  SmallSpanSequence *statementMap;
  uint local_34;
  
  local_34 = 0;
  if (this->m_workItemData->type == '\x01') {
    uVar6 = GetLoopNumber(this);
    pJVar8 = JITTimeFunctionBody::GetLoopHeaderData(&this->m_jitBody,uVar6);
    local_34 = pJVar8->startOffset;
  }
  if (this->m_workItemData->isJitInDebugMode != '\0') {
    pAVar9 = (ArenaStatementMapList *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
    (pAVar9->
    super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>).
    buffer = (Type)0x0;
    (pAVar9->
    super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>).
    count = 0;
    (pAVar9->
    super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>).
    alloc = alloc;
    (pAVar9->
    super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014ea9e8;
    pAVar9->length = 0;
    pAVar9->increment = 4;
    this->m_fullStatementList = pAVar9;
    pJVar1 = &this->m_jitBody;
    pSVar10 = JITTimeFunctionBody::GetFullStatementMap(pJVar1);
    uVar6 = JITTimeFunctionBody::GetFullStatementMapCount(pJVar1);
    if (uVar6 != 0) {
      uVar15 = 0;
      do {
        this_00 = this->m_fullStatementList;
        JsUtil::
        List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(this_00,0);
        iVar3 = (this_00->
                super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        (this_00->
        super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).buffer[iVar3] = (StatementMap *)pSVar10;
        (this_00->
        super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_DefaultComparer>
        ).count = iVar3 + 1;
        uVar15 = uVar15 + 1;
        uVar6 = JITTimeFunctionBody::GetFullStatementMapCount(pJVar1);
        pSVar10 = pSVar10 + 1;
      } while (uVar15 < uVar6);
    }
  }
  pJVar1 = &this->m_jitBody;
  pbVar11 = JITTimeFunctionBody::GetByteCodeBuffer(pJVar1);
  uVar6 = JITTimeFunctionBody::GetByteCodeLength(pJVar1);
  Js::ByteCodeReader::Create(reader,pbVar11,local_34,uVar6);
  this_01 = (FunctionProxy *)JITTimeFunctionBody::GetAddr(pJVar1);
  this_02 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)Js::FunctionProxy::GetAuxPtrWithLock(this_01,StatementMaps);
  if (this->m_fullStatementList != (ArenaStatementMapList *)0x0) {
    uVar7 = JITTimeFunctionBody::GetFullStatementMapCount(pJVar1);
    uVar6 = (this_02->
            super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>)
            .count;
    if (uVar7 != uVar6 || (int)uVar6 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                         ,100,
                         "(!m_fullStatementList || ((int)m_jitBody.GetFullStatementMapCount() == runtimeMap->Count() && runtimeMap->Count() >= 0))"
                         ,
                         "!m_fullStatementList || ((int)m_jitBody.GetFullStatementMapCount() == runtimeMap->Count() && runtimeMap->Count() >= 0)"
                        );
      if (!bVar5) {
LAB_005747c0:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar12 = 0;
    }
  }
  uVar6 = JITTimeFunctionBody::GetFullStatementMapCount(pJVar1);
  if (uVar6 != 0) {
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    index = 0;
    do {
      pTVar13 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,index);
      iVar3 = (pTVar13->ptr->byteCodeSpan).begin;
      ppSVar14 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,index);
      if (iVar3 != ((*ppSVar14)->byteCodeSpan).begin) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x67,
                           "(runtimeMap->Item(i)->byteCodeSpan.begin == m_fullStatementList->Item(i)->byteCodeSpan.begin)"
                           ,
                           "runtimeMap->Item(i)->byteCodeSpan.begin == m_fullStatementList->Item(i)->byteCodeSpan.begin"
                          );
        if (!bVar5) goto LAB_005747c0;
        *puVar12 = 0;
      }
      pTVar13 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,index);
      iVar3 = (pTVar13->ptr->byteCodeSpan).end;
      ppSVar14 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,index);
      if (iVar3 != ((*ppSVar14)->byteCodeSpan).end) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x68,
                           "(runtimeMap->Item(i)->byteCodeSpan.end == m_fullStatementList->Item(i)->byteCodeSpan.end)"
                           ,
                           "runtimeMap->Item(i)->byteCodeSpan.end == m_fullStatementList->Item(i)->byteCodeSpan.end"
                          );
        if (!bVar5) goto LAB_005747c0;
        *puVar12 = 0;
      }
      pTVar13 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,index);
      iVar3 = (pTVar13->ptr->sourceSpan).begin;
      ppSVar14 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,index);
      if (iVar3 != ((*ppSVar14)->sourceSpan).begin) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x69,
                           "(runtimeMap->Item(i)->sourceSpan.begin == m_fullStatementList->Item(i)->sourceSpan.begin)"
                           ,
                           "runtimeMap->Item(i)->sourceSpan.begin == m_fullStatementList->Item(i)->sourceSpan.begin"
                          );
        if (!bVar5) goto LAB_005747c0;
        *puVar12 = 0;
      }
      pTVar13 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,index);
      iVar3 = (pTVar13->ptr->sourceSpan).end;
      ppSVar14 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,index);
      if (iVar3 != ((*ppSVar14)->sourceSpan).end) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x6a,
                           "(runtimeMap->Item(i)->sourceSpan.end == m_fullStatementList->Item(i)->sourceSpan.end)"
                           ,
                           "runtimeMap->Item(i)->sourceSpan.end == m_fullStatementList->Item(i)->sourceSpan.end"
                          );
        if (!bVar5) goto LAB_005747c0;
        *puVar12 = 0;
      }
      pTVar13 = JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,index);
      TVar2 = pTVar13->ptr->isSubexpression;
      ppSVar14 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullStatementList,index);
      if (TVar2 != (*ppSVar14)->isSubexpression) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeWorkItem.cpp"
                           ,0x6b,
                           "(runtimeMap->Item(i)->isSubexpression == m_fullStatementList->Item(i)->isSubexpression)"
                           ,
                           "runtimeMap->Item(i)->isSubexpression == m_fullStatementList->Item(i)->isSubexpression"
                          );
        if (!bVar5) goto LAB_005747c0;
        *puVar12 = 0;
      }
      index = index + 1;
      uVar6 = JITTimeFunctionBody::GetFullStatementMapCount(pJVar1);
    } while (index < uVar6);
  }
  bVar5 = JITTimeFunctionBody::InitializeStatementMap(pJVar1,&this->m_statementMap,alloc);
  if (statementReader !=
      (StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
       *)0x0) {
    statementMap = (SmallSpanSequence *)0x0;
    if (bVar5) {
      statementMap = &this->m_statementMap;
    }
    pbVar11 = JITTimeFunctionBody::GetByteCodeBuffer(pJVar1);
    Js::
    StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::Create(statementReader,pbVar11,local_34,statementMap,this->m_fullStatementList);
    return;
  }
  return;
}

Assistant:

void
JITTimeWorkItem::InitializeReader(
    Js::ByteCodeReader * reader,
    Js::StatementReader<Js::FunctionBody::ArenaStatementMapList> * statementReader, ArenaAllocator* alloc)
{
    uint startOffset = IsLoopBody() ? GetLoopHeader()->startOffset : 0;

    if (IsJitInDebugMode())
    {
        // TODO: OOP JIT, directly use the array rather than making a list
        m_fullStatementList = Js::FunctionBody::ArenaStatementMapList::New(alloc);
        CompileAssert(sizeof(StatementMapIDL) == sizeof(Js::FunctionBody::StatementMap));

        StatementMapIDL * fullArr = m_jitBody.GetFullStatementMap();
        for (uint i = 0; i < m_jitBody.GetFullStatementMapCount(); ++i)
        {
            m_fullStatementList->Add((Js::FunctionBody::StatementMap*)&fullArr[i]);
        }
    }
#if DBG
    reader->Create(m_jitBody.GetByteCodeBuffer(), startOffset, m_jitBody.GetByteCodeLength());
    if (!JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        Js::FunctionBody::StatementMapList * runtimeMap = ((Js::FunctionBody*)m_jitBody.GetAddr())->GetStatementMaps();
        Assert(!m_fullStatementList || ((int)m_jitBody.GetFullStatementMapCount() == runtimeMap->Count() && runtimeMap->Count() >= 0));
        for (uint i = 0; i < m_jitBody.GetFullStatementMapCount(); ++i)
        {
            Assert(runtimeMap->Item(i)->byteCodeSpan.begin == m_fullStatementList->Item(i)->byteCodeSpan.begin);
            Assert(runtimeMap->Item(i)->byteCodeSpan.end == m_fullStatementList->Item(i)->byteCodeSpan.end);
            Assert(runtimeMap->Item(i)->sourceSpan.begin == m_fullStatementList->Item(i)->sourceSpan.begin);
            Assert(runtimeMap->Item(i)->sourceSpan.end == m_fullStatementList->Item(i)->sourceSpan.end);
            Assert(runtimeMap->Item(i)->isSubexpression == m_fullStatementList->Item(i)->isSubexpression);
        }
    }
#else
    reader->Create(m_jitBody.GetByteCodeBuffer(), startOffset);
#endif
    bool hasSpanSequenceMap = m_jitBody.InitializeStatementMap(&m_statementMap, alloc);
    Js::SmallSpanSequence * spanSeq = hasSpanSequenceMap ? &m_statementMap : nullptr;
    if (statementReader)
    {
        statementReader->Create(m_jitBody.GetByteCodeBuffer(), startOffset, spanSeq, m_fullStatementList);
    }
}